

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

void mwAbort(void)

{
  mwData **ppmVar1;
  mwMarker *pmVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  __int32_t **pp_Var6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  mwData *pmVar10;
  ulong uVar11;
  size_t sVar12;
  mwStat **ppmVar13;
  char *pcVar14;
  mwStat **ppmVar15;
  long lVar16;
  ulong uVar17;
  mwData *pmVar18;
  long lVar19;
  char *pcVar20;
  time_t tid;
  
  tid = time((time_t *)0x0);
  ctime(&tid);
  mwWrite("\nStopped at %s\n");
  if (mwInited == 0) {
    mwWrite("internal: mwAbort(): MEMWATCH not initialized!\n");
  }
  if (mwTestAlways != 0) {
    mwTestNow((char *)0x0,0,1);
  }
  mwDrop_(0,0xfb,0);
  mwDrop_(0,0xfc,0);
  if (mwGrabList != (mwGrabData *)0x0) {
    mwWrite("internal: the grab list is not empty after mwDropAll()\n");
  }
  while (mwFirstMark != (mwMarker *)0x0) {
    pmVar2 = mwFirstMark->next;
    mwWrite("mark: %p: %s\n",mwFirstMark->host,mwFirstMark->text);
    free(mwFirstMark->text);
    free(mwFirstMark);
    mwErrors = mwErrors + 1;
    mwFirstMark = pmVar2;
  }
  for (iVar9 = 0; iVar9 != 3; iVar9 = iVar9 + 1) {
    while( true ) {
      if (mwHead == (mwData *)0x0) goto LAB_00105f54;
      iVar3 = mwIsOwned(mwHead,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/memwatch.c"
                        ,0x230);
      pmVar10 = mwHead;
      if (iVar3 == 0) break;
      mwFlushingB2 = 0;
      mwFlushingB1 = 0;
      mwFlushing = 0;
      if ((mwHead->flag & 1) == 0) {
        mwErrors = mwErrors + 1;
        pmVar10 = mwHead + 1;
        if (mwDataSize == '\0') {
          pmVar10 = mwHead;
        }
        ppmVar1 = &pmVar10->next;
        mwWrite("unfreed: <%ld> %s(%d), %ld bytes at %p ",mwHead->count,mwHead->file,
                (ulong)(uint)mwHead->line,mwHead->size,ppmVar1);
        iVar3 = mwCheckOF(pmVar10);
        if (iVar3 != 0) {
          mwWrite("[underflowed] ");
          mwFlush();
        }
        iVar3 = mwCheckOF((void *)(mwHead->size + (long)ppmVar1));
        if (iVar3 != 0) {
          mwWrite("[overflowed] ");
          mwFlush();
        }
        mwWrite(" \t{");
        uVar11 = mwHead->size;
        if (0xf < mwHead->size) {
          uVar11 = 0x10;
        }
        for (uVar17 = 0; uVar17 != 0x10; uVar17 = uVar17 + 1) {
          if (uVar17 < uVar11) {
            mwWrite("%02X ",(ulong)*(byte *)((long)ppmVar1 + uVar17));
          }
          else {
            mwWrite(".. ");
          }
        }
        for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
          uVar8 = *(byte *)((long)ppmVar1 + uVar17) - 0x7f;
          uVar7 = 0x2e;
          if (0xa0 < (byte)uVar8) {
            uVar7 = (ulong)*(byte *)((long)ppmVar1 + uVar17);
          }
          mwWrite("%c",(ulong)(uint)(int)(char)uVar7,(ulong)uVar8,uVar7);
        }
        mwWrite("}\n");
        pmVar10 = mwHead;
        mwUnlink(mwHead,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/memwatch.c",
                 0x25f);
      }
      else {
        pmVar18 = mwHead + 1;
        if (mwDataSize == '\0') {
          pmVar18 = mwHead;
        }
        sVar12 = mwHead->size;
        pvVar4 = mwTestMem(&pmVar18->next,(uint)sVar12,0xfc);
        if (pvVar4 != (void *)0x0) {
          mwErrors = mwErrors + 1;
          mwWrite("wild pointer: <%ld> NoMansLand %p alloc\'d at %s(%d)\n",pmVar10->count,
                  &pmVar18->file,pmVar10->file,(ulong)(uint)pmVar10->line);
          mwFlush();
          sVar12 = mwHead->size;
          pmVar10 = mwHead;
        }
        mwNmlNumAlloc = mwNmlNumAlloc + -1;
        mwNmlCurAlloc = mwNmlCurAlloc - sVar12;
        mwUnlink(pmVar10,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/memwatch.c",
                 0x26c);
      }
      free(pmVar10);
    }
    mwWrite("internal: NML/unfreed scan restarting\n");
    mwFlush();
  }
LAB_00105f54:
  if (mwNmlNumAlloc != 0) {
    mwWrite("internal: NoMansLand block counter %ld, not zero\n");
  }
  if (mwNmlCurAlloc != 0) {
    mwWrite("internal: NoMansLand byte counter %ld, not zero\n");
  }
  mwWrite("\nMemory usage statistics (global):\n");
  mwWrite(" N)umber of allocations made: %ld\n",mwStatNumAlloc);
  mwWrite(" L)argest memory usage      : %ld\n",mwStatMaxAlloc);
  mwWrite(" T)otal of all alloc() calls: %ld\n",mwStatTotAlloc);
  mwWrite(" U)nfreed bytes totals      : %ld\n",mwStatCurAlloc);
  mwFlush();
  if (0 < mwStatLevel) {
    mwWrite("\nMemory usage statistics (detailed):\n");
    mwWrite(" Module/Line                                Number   Largest  Total    Unfreed \n");
    ppmVar15 = &mwStatList;
    while (ppmVar15 = &((mwStat *)ppmVar15)->next->next, (mwStat *)ppmVar15 != (mwStat *)0x0) {
      if (((mwStat *)ppmVar15)->line == -1) {
        pcVar20 = "<unknown>";
        if (((mwStat *)ppmVar15)->file != (char *)0x0) {
          iVar9 = mwIsReadAddr(((mwStat *)ppmVar15)->file,0x16);
          pcVar20 = "<unknown>";
          if (iVar9 != 0) {
            pcVar20 = ((mwStat *)ppmVar15)->file;
          }
        }
        sVar5 = strlen(pcVar20);
        pcVar14 = pcVar20 + ((ulong)((uint)sVar5 & 0x7fffffff) - 0x2a);
        if ((int)(uint)sVar5 < 0x2b) {
          pcVar14 = pcVar20;
        }
        mwWrite(" %-42s %-8ld %-8ld %-8ld %-8ld\n",pcVar14,((mwStat *)ppmVar15)->num,
                ((mwStat *)ppmVar15)->max,((mwStat *)ppmVar15)->total,((mwStat *)ppmVar15)->curr);
        if ((((mwStat *)ppmVar15)->file != (char *)0x0) && (1 < mwStatLevel)) {
          ppmVar13 = &mwStatList;
LAB_001060be:
          ppmVar13 = &((mwStat *)ppmVar13)->next->next;
          if ((mwStat *)ppmVar13 != (mwStat *)0x0) {
            uVar8 = ((mwStat *)ppmVar13)->line;
            if ((uVar8 != 0xffffffff) &&
               (pcVar20 = ((mwStat *)ppmVar13)->file, pcVar20 != (char *)0x0)) {
              pcVar14 = ((mwStat *)ppmVar15)->file;
              if (pcVar14 != (char *)0x0) {
                for (lVar19 = 0; lVar16 = (long)pcVar20[lVar19], lVar16 != 0; lVar19 = lVar19 + 1) {
                  pp_Var6 = __ctype_toupper_loc();
                  if ((*pp_Var6)[pcVar14[lVar19]] != (*pp_Var6)[lVar16]) goto LAB_001060be;
                }
              }
              mwWrite("  %-8d                                  %-8ld %-8ld %-8ld %-8ld\n",
                      (ulong)uVar8,((mwStat *)ppmVar13)->num,((mwStat *)ppmVar13)->max,
                      ((mwStat *)ppmVar13)->total,((mwStat *)ppmVar13)->curr);
            }
            goto LAB_001060be;
          }
        }
      }
    }
  }
  mwFlush();
  mwInited = 0;
  mwTail = (mwData *)0x0;
  mwHead = (mwData *)0x0;
  if (mwErrors != 0) {
    fprintf(_stderr,"MEMWATCH detected %ld anomalies\n");
  }
  mwLogFile((char *)0x0);
  mwErrors = 0;
  return;
}

Assistant:

void mwAbort(void)
{
	mwData *mw;
	mwMarker *mrk;
	char *data;
	time_t tid;
	int c, i, j;
	int errors;

	tid = time(NULL);
	mwWrite("\nStopped at %s\n", ctime(&tid));

	if (!mwInited) {
		mwWrite("internal: mwAbort(): MEMWATCH not initialized!\n");
	}

	/* release the grab list */
	mwDropAll();

	/* report mwMarked items */
	while (mwFirstMark) {
		mrk = mwFirstMark->next;
		mwWrite("mark: %p: %s\n", mwFirstMark->host, mwFirstMark->text);
		free(mwFirstMark->text);
		free(mwFirstMark);
		mwFirstMark = mrk;
		mwErrors ++;
	}

	/* release all still allocated memory */
	errors = 0;
	while (mwHead != NULL && errors < 3) {
		if (!mwIsOwned(mwHead, __FILE__, __LINE__)) {
			if (errors < 3) {
				errors ++;
				mwWrite("internal: NML/unfreed scan restarting\n");
				FLUSH();
				mwHead = mwHead;
				continue;
			}
			mwWrite("internal: NML/unfreed scan aborted, heap too damaged\n");
			FLUSH();
			break;
		}
		mwFlushW(0);
		if (!(mwHead->flag & MW_NML)) {
			mwErrors++;
			data = ((char *)mwHead) + mwDataSize;
			mwWrite("unfreed: <%ld> %s(%d), %ld bytes at %p ",
					mwHead->count, mwHead->file, mwHead->line, (long)mwHead->size, data + mwOverflowZoneSize);
			if (mwCheckOF(data)) {
				mwWrite("[underflowed] ");
				FLUSH();
			}
			if (mwCheckOF((data + mwOverflowZoneSize + mwHead->size))) {
				mwWrite("[overflowed] ");
				FLUSH();
			}
			mwWrite(" \t{");
			j = 16;
			if (mwHead->size < 16) {
				j = (int) mwHead->size;
			}
			for (i = 0; i < 16; i++) {
				if (i < j) mwWrite("%02X ",
									   (unsigned char) * (data + mwOverflowZoneSize + i));
				else {
					mwWrite(".. ");
				}
			}
			for (i = 0; i < j; i++) {
				c = *(data + mwOverflowZoneSize + i);
				if (c < 32 || c > 126) {
					c = '.';
				}
				mwWrite("%c", c);
			}
			mwWrite("}\n");
			mw = mwHead;
			mwUnlink(mw, __FILE__, __LINE__);
			free(mw);
		} else {
			data = ((char *)mwHead) + mwDataSize + mwOverflowZoneSize;
			if (mwTestMem(data, mwHead->size, MW_VAL_NML)) {
				mwErrors++;
				mwWrite("wild pointer: <%ld> NoMansLand %p alloc'd at %s(%d)\n",
						mwHead->count, data + mwOverflowZoneSize, mwHead->file, mwHead->line);
				FLUSH();
			}
			mwNmlNumAlloc --;
			mwNmlCurAlloc -= mwHead->size;
			mw = mwHead;
			mwUnlink(mw, __FILE__, __LINE__);
			free(mw);
		}
	}

	if (mwNmlNumAlloc) {
		mwWrite("internal: NoMansLand block counter %ld, not zero\n", mwNmlNumAlloc);
	}
	if (mwNmlCurAlloc) {
		mwWrite("internal: NoMansLand byte counter %ld, not zero\n", mwNmlCurAlloc);
	}

	/* report statistics */
	mwStatReport();
	FLUSH();

	mwInited = 0;
	mwHead = mwTail = NULL;
	if (mwErrors) {
		fprintf(mwSTDERR, "MEMWATCH detected %ld anomalies\n", mwErrors);
	}
	mwLogFile(NULL);
	mwErrors = 0;

	MW_MUTEX_TERM();

}